

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

void pstrcpy(char *buf,int buf_size,char *str)

{
  char *local_30;
  char *q;
  char *pcStack_20;
  int c;
  char *str_local;
  int buf_size_local;
  char *buf_local;
  
  local_30 = buf;
  pcStack_20 = str;
  if (0 < buf_size) {
    while( true ) {
      if ((*pcStack_20 == '\0') || (buf + (long)buf_size + -1 <= local_30)) break;
      *local_30 = *pcStack_20;
      local_30 = local_30 + 1;
      pcStack_20 = pcStack_20 + 1;
    }
    *local_30 = '\0';
  }
  return;
}

Assistant:

void pstrcpy(char *buf, int buf_size, const char *str)
{
    int c;
    char *q = buf;

    if (buf_size <= 0)
        return;

    for(;;) {
        c = *str++;
        if (c == 0 || q >= buf + buf_size - 1)
            break;
        *q++ = c;
    }
    *q = '\0';
}